

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O0

void __thiscall Fl_Shared_Image::color_average(Fl_Shared_Image *this,Fl_Color c,float i)

{
  float i_local;
  Fl_Color c_local;
  Fl_Shared_Image *this_local;
  
  if (this->image_ != (Fl_Image *)0x0) {
    (*this->image_->_vptr_Fl_Image[3])(i,this->image_,(ulong)c);
    update(this);
  }
  return;
}

Assistant:

void
Fl_Shared_Image::color_average(Fl_Color c,	// I - Color to blend with
                               float    i) {	// I - Blend fraction
  if (!image_) return;

  image_->color_average(c, i);
  update();
}